

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

CompressedTexFormat vk::mapVkCompressedFormat(VkFormat format)

{
  InternalError *this;
  CompressedTexFormat local_c;
  VkFormat format_local;
  
  switch(format) {
  case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ETC2_RGB8;
    break;
  case VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ETC2_SRGB8;
    break;
  case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1;
    break;
  case VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1;
    break;
  case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8;
    break;
  case VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_EAC_R11_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_EAC_R11;
    break;
  case VK_FORMAT_EAC_R11_SNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_EAC_SIGNED_R11;
    break;
  case VK_FORMAT_EAC_R11G11_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_EAC_RG11;
    break;
  case VK_FORMAT_EAC_R11G11_SNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11;
    break;
  case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
    break;
  case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA;
    break;
  case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA;
    break;
  case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA;
    break;
  case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA;
    break;
  case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA;
    break;
  case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA;
    break;
  case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA;
    break;
  case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA;
    break;
  case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA;
    break;
  case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA;
    break;
  case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA;
    break;
  case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA;
    break;
  case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8;
    break;
  case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA;
    break;
  case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:
    local_c = COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8;
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unknown image format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
               ,0x262);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return local_c;
}

Assistant:

tcu::CompressedTexFormat mapVkCompressedFormat (VkFormat format)
{
	// update this mapping if VkFormat changes
	DE_STATIC_ASSERT(VK_CORE_FORMAT_LAST == 185);

	switch (format)
	{
		case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8;
		case VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8;
		case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK:	return tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1;
		case VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK:	return tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1;
		case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK:	return tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8;
		case VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK:	return tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8;

		case VK_FORMAT_EAC_R11_UNORM_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_EAC_R11;
		case VK_FORMAT_EAC_R11_SNORM_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11;
		case VK_FORMAT_EAC_R11G11_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_EAC_RG11;
		case VK_FORMAT_EAC_R11G11_SNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11;

		case VK_FORMAT_ASTC_4x4_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
		case VK_FORMAT_ASTC_4x4_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_5x4_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA;
		case VK_FORMAT_ASTC_5x4_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_5x5_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA;
		case VK_FORMAT_ASTC_5x5_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_6x5_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA;
		case VK_FORMAT_ASTC_6x5_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_6x6_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA;
		case VK_FORMAT_ASTC_6x6_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_8x5_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA;
		case VK_FORMAT_ASTC_8x5_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_8x6_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA;
		case VK_FORMAT_ASTC_8x6_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_8x8_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA;
		case VK_FORMAT_ASTC_8x8_SRGB_BLOCK:			return tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_10x5_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA;
		case VK_FORMAT_ASTC_10x5_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_10x6_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA;
		case VK_FORMAT_ASTC_10x6_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_10x8_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA;
		case VK_FORMAT_ASTC_10x8_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_10x10_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA;
		case VK_FORMAT_ASTC_10x10_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_12x10_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA;
		case VK_FORMAT_ASTC_12x10_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8;
		case VK_FORMAT_ASTC_12x12_UNORM_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA;
		case VK_FORMAT_ASTC_12x12_SRGB_BLOCK:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8;

		default:
			TCU_THROW(InternalError, "Unknown image format");
			return tcu::COMPRESSEDTEXFORMAT_LAST;
	}
}